

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcoll.cpp
# Opt level: O2

int __thiscall
CVmObjCollection::const_get_coll_prop
          (CVmObjCollection *this,vm_prop_id_t prop,vm_val_t *retval,vm_val_t *self_val,
          vm_obj_id_t *src_obj,uint *argc)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  long *plVar4;
  
  *src_obj = 0;
  uVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  pcVar3 = (code *)func_table_[(ulong)uVar1 * 2];
  plVar4 = (long *)((long)&(this->super_CVmObject)._vptr_CVmObject +
                   func_table_[(ulong)uVar1 * 2 + 1]);
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
  }
  iVar2 = (*pcVar3)(plVar4,retval,self_val,argc);
  return (int)(iVar2 != 0);
}

Assistant:

int CVmObjCollection::const_get_coll_prop(VMG_ vm_prop_id_t prop,
                                          vm_val_t *retval,
                                          const vm_val_t *self_val,
                                          vm_obj_id_t *src_obj,
                                          uint *argc)
{
    uint func_idx;

    /* presume no source object */
    *src_obj = VM_INVALID_OBJ;

    /* translate the property index to an index into our function table */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((this->*func_table_[func_idx])(vmg_ retval, self_val, argc))
        return TRUE;

    /* not found */
    return FALSE;
}